

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitCloud.c
# Opt level: O0

uint * Kit_TruthCompose(CloudManager *dd,uint *pTruth,int nVars,uint **pInputs,int nVarsAll,
                       Vec_Ptr_t *vStore,Vec_Int_t *vNodes)

{
  int iVar1;
  int iVar2;
  CloudNode *pFunc_00;
  uint *pIn0;
  uint *pIn1;
  int RetValue;
  int Entry;
  int i;
  Kit_Mux_t Mux;
  uint *pFan1;
  uint *pFan0;
  uint *pThis;
  CloudNode *pFunc;
  Vec_Ptr_t *vStore_local;
  int nVarsAll_local;
  uint **pInputs_local;
  int nVars_local;
  uint *pTruth_local;
  CloudManager *dd_local;
  
  Cloud_Restart(dd);
  pFunc_00 = Kit_TruthToCloud(dd,pTruth,nVars);
  iVar1 = Kit_CreateCloud(dd,pFunc_00,vNodes);
  if (iVar1 == 0) {
    printf("Kit_TruthCompose(): Internal failure!!!\n");
  }
  iVar1 = Vec_IntSize(vNodes);
  iVar2 = Vec_PtrSize(vStore);
  if (iVar2 < iVar1) {
    __assert_fail("Vec_IntSize(vNodes) <= Vec_PtrSize(vStore)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitCloud.c"
                  ,0x11a,
                  "unsigned int *Kit_TruthCompose(CloudManager *, unsigned int *, int, unsigned int **, int, Vec_Ptr_t *, Vec_Int_t *)"
                 );
  }
  pFan0 = (uint *)Vec_PtrEntry(vStore,0);
  Kit_TruthFill(pFan0,nVarsAll);
  for (RetValue = 1; iVar1 = Vec_IntSize(vNodes), RetValue < iVar1; RetValue = RetValue + 1) {
    iVar1 = Vec_IntEntry(vNodes,RetValue);
    Entry = (int)Kit_Int2Mux(iVar1);
    pIn0 = (uint *)Vec_PtrEntry(vStore,(uint)Entry >> 0x11 & 0xfff);
    pIn1 = (uint *)Vec_PtrEntry(vStore,(uint)Entry >> 5 & 0xfff);
    pFan0 = (uint *)Vec_PtrEntry(vStore,RetValue);
    Kit_TruthMuxPhase(pFan0,pIn0,pIn1,pInputs[(int)((nVars + -1) - (Entry & 0x1fU))],nVarsAll,
                      (uint)Entry >> 0x1d & 1);
  }
  if (((uint)Entry >> 0x1e & 1) != 0) {
    Kit_TruthNot(pFan0,pFan0,nVarsAll);
  }
  return pFan0;
}

Assistant:

unsigned * Kit_TruthCompose( CloudManager * dd, unsigned * pTruth, int nVars, 
    unsigned ** pInputs, int nVarsAll, Vec_Ptr_t * vStore, Vec_Int_t * vNodes )
{
    CloudNode * pFunc;
    unsigned * pThis, * pFan0, * pFan1;
    Kit_Mux_t Mux;
    int i, Entry, RetValue;
    // derive BDD from truth table
    Cloud_Restart( dd );
    pFunc = Kit_TruthToCloud( dd, pTruth, nVars );
    // convert it into nodes
    RetValue = Kit_CreateCloud( dd, pFunc, vNodes );
    if ( RetValue == 0 )
        printf( "Kit_TruthCompose(): Internal failure!!!\n" );
    // verify the result
//    pFan0 = Kit_CloudToTruth( vNodes, nVars, vStore, 0 );
//    if ( !Kit_TruthIsEqual( pTruth, pFan0, nVars ) )
//        printf( "Failed!\n" );
    // compute truth table from the BDD
    assert( Vec_IntSize(vNodes) <= Vec_PtrSize(vStore) );
    pThis = (unsigned *)Vec_PtrEntry( vStore, 0 );
    Kit_TruthFill( pThis, nVarsAll );
    Vec_IntForEachEntryStart( vNodes, Entry, i, 1 )
    {
        Mux = Kit_Int2Mux(Entry);
        pFan0 = (unsigned *)Vec_PtrEntry( vStore, Mux.e );
        pFan1 = (unsigned *)Vec_PtrEntry( vStore, Mux.t );
        pThis = (unsigned *)Vec_PtrEntry( vStore, i );
        Kit_TruthMuxPhase( pThis, pFan0, pFan1, pInputs[nVars-1-Mux.v], nVarsAll, Mux.c );
    }
    // complement the result
    if ( Mux.i )
        Kit_TruthNot( pThis, pThis, nVarsAll );
    return pThis;
}